

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

void __thiscall
duckdb::RowGroupCollection::Initialize(RowGroupCollection *this,PersistentCollectionData *data)

{
  pointer pPVar1;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var2;
  RowGroupSegmentTree *pRVar3;
  RowGroup *this_00;
  pointer pRVar4;
  pointer *__ptr;
  pointer data_00;
  SegmentLock l;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_58;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_50;
  TableStatistics *local_48;
  unique_lock<std::mutex> local_40;
  
  local_48 = &this->stats;
  TableStatistics::InitializeEmpty(local_48,&this->types);
  pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
  local_40._M_device = &(pRVar3->super_SegmentTree<duckdb::RowGroup,_true>).node_lock;
  local_40._M_owns = false;
  ::std::unique_lock<std::mutex>::lock(&local_40);
  local_40._M_owns = true;
  data_00 = (data->row_group_data).
            super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
            .
            super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar1 = (data->row_group_data).
           super_vector<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           .
           super__Vector_base<duckdb::PersistentRowGroupData,_std::allocator<duckdb::PersistentRowGroupData>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (data_00 != pPVar1) {
    do {
      this_00 = (RowGroup *)operator_new(200);
      RowGroup::RowGroup(this_00,this,data_00);
      local_50._M_head_impl = this_00;
      pRVar4 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)&local_50);
      RowGroup::MergeIntoStatistics(pRVar4,local_48);
      pRVar4 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                         ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                           *)&local_50);
      LOCK();
      (this->total_rows).super___atomic_base<unsigned_long>._M_i =
           (this->total_rows).super___atomic_base<unsigned_long>._M_i +
           (pRVar4->super_SegmentBase<duckdb::RowGroup>).count.super___atomic_base<unsigned_long>.
           _M_i;
      UNLOCK();
      pRVar3 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&this->row_groups);
      local_58._M_head_impl = local_50._M_head_impl;
      local_50._M_head_impl = (RowGroup *)0x0;
      SegmentTree<duckdb::RowGroup,_true>::AppendSegment
                (&pRVar3->super_SegmentTree<duckdb::RowGroup,_true>,(SegmentLock *)&local_40,
                 (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
                 &local_58);
      _Var2._M_head_impl = local_58._M_head_impl;
      if (local_58._M_head_impl != (RowGroup *)0x0) {
        RowGroup::~RowGroup(local_58._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      _Var2._M_head_impl = local_50._M_head_impl;
      local_58._M_head_impl = (RowGroup *)0x0;
      if (local_50._M_head_impl != (RowGroup *)0x0) {
        RowGroup::~RowGroup(local_50._M_head_impl);
        operator_delete(_Var2._M_head_impl);
      }
      data_00 = data_00 + 1;
    } while (data_00 != pPVar1);
  }
  ::std::unique_lock<std::mutex>::~unique_lock(&local_40);
  return;
}

Assistant:

void RowGroupCollection::Initialize(PersistentCollectionData &data) {
	stats.InitializeEmpty(types);
	auto l = row_groups->Lock();
	for (auto &row_group_data : data.row_group_data) {
		auto row_group = make_uniq<RowGroup>(*this, row_group_data);
		row_group->MergeIntoStatistics(stats);
		total_rows += row_group->count;
		row_groups->AppendSegment(l, std::move(row_group));
	}
}